

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  string local_50;
  string local_30;
  RedirectedStreams *local_10;
  RedirectedStreams *this_local;
  
  local_10 = this;
  RedirectedStdOut::str_abi_cxx11_(&local_30,&this->m_redirectedStdOut);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (this->m_redirectedCout,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  RedirectedStdErr::str_abi_cxx11_(&local_50,&this->m_redirectedStdErr);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (this->m_redirectedCerr,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  RedirectedStdErr::~RedirectedStdErr(&this->m_redirectedStdErr);
  RedirectedStdOut::~RedirectedStdOut(&this->m_redirectedStdOut);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }